

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  mat3f a;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  float fVar2;
  undefined8 in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined4 in_XMM5_Da;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vec3f vVar3;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  float in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined4 in_stack_00000038;
  BasicPrimitive *in_stack_fffffffffffffd40;
  vec3f *in_stack_fffffffffffffd48;
  vec3f *in_stack_fffffffffffffd50;
  undefined8 uVar4;
  undefined4 in_stack_fffffffffffffdec;
  undefined8 uVar5;
  undefined4 in_stack_fffffffffffffdfc;
  float fVar6;
  vec3f local_1e4;
  vec3f local_1d8;
  vec3f local_1c8;
  vec3f local_1b8;
  vec3f local_1a8;
  mat3f local_198;
  undefined1 local_174 [36];
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_84;
  float local_7c;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_10;
  undefined4 local_8;
  
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_70 = in_XMM7_Qa;
  local_68 = in_XMM6_Qa;
  local_50 = in_XMM4_Qa;
  local_48 = in_XMM5_Da;
  local_30 = in_XMM2_Qa;
  local_28 = in_XMM3_Da;
  local_8 = in_XMM1_Da;
  BasicPrimitive::BasicPrimitive(in_stack_fffffffffffffd40);
  *in_RDI = &PTR_intersect_001e8048;
  *(undefined4 *)(in_RDI + 2) = local_8;
  in_RDI[1] = local_10;
  *(undefined4 *)((long)in_RDI + 0x1c) = local_28;
  *(undefined8 *)((long)in_RDI + 0x14) = local_30;
  *(undefined4 *)(in_RDI + 5) = local_48;
  in_RDI[4] = local_50;
  *(float *)((long)in_RDI + 0x34) = in_stack_00000018;
  *(undefined8 *)((long)in_RDI + 0x2c) = in_stack_00000010;
  *(undefined4 *)(in_RDI + 8) = in_stack_00000028;
  in_RDI[7] = in_stack_00000020;
  *(undefined4 *)((long)in_RDI + 0x4c) = in_stack_00000038;
  *(undefined8 *)((long)in_RDI + 0x44) = in_stack_00000030;
  in_RDI[10] = local_68;
  in_RDI[0xb] = local_70;
  in_RDI[0xc] = in_stack_00000008;
  mat3f::mat3f((mat3f *)0x17a553);
  vec3f::vec3f((vec3f *)((long)in_RDI + 0x8c));
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_a8 = vVar3.z;
  local_b0 = vVar3._0_8_;
  local_a0 = local_b0;
  local_98 = local_a8;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_c8 = vVar3.z;
  local_d0 = vVar3._0_8_;
  local_c0 = local_d0;
  local_b8 = local_c8;
  vVar3 = cross(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_d8 = vVar3.z;
  local_e0 = vVar3._0_8_;
  local_90 = local_e0;
  local_88 = local_d8;
  vVar3 = normalized(in_stack_fffffffffffffd50);
  local_e8 = vVar3.z;
  local_f0 = vVar3._0_8_;
  *(undefined8 *)((long)in_RDI + 0x8c) = local_f0;
  *(float *)((long)in_RDI + 0x94) = local_e8;
  local_84 = local_f0;
  local_7c = local_e8;
  fVar1 = dot((vec3f *)((long)in_RDI + 0x8c),(vec3f *)&stack0x00000010);
  if (fVar1 < 0.0) {
    operator*=((vec3f *)((long)in_RDI + 0x8c),-1.0);
  }
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_118 = vVar3.z;
  local_120 = vVar3._0_8_;
  local_110 = local_120;
  local_108 = local_118;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_138 = vVar3.z;
  local_140 = vVar3._0_8_;
  local_130 = local_140;
  local_128 = local_138;
  vVar3 = cross(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_148 = vVar3.z;
  local_150 = vVar3._0_8_;
  local_100 = local_150;
  local_f8 = local_148;
  fVar1 = norm((vec3f *)0x17a7b0);
  *(float *)(in_RDI + 0x13) = 1.0 / fVar1;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_1b8.z = vVar3.z;
  local_1b8._0_8_ = vVar3._0_8_;
  local_1a8._0_8_ = local_1b8._0_8_;
  local_1a8.z = local_1b8.z;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_1d8.z = vVar3.z;
  local_1d8._0_8_ = vVar3._0_8_;
  local_1c8._0_8_ = local_1d8._0_8_;
  local_1c8.z = local_1d8.z;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  fVar6 = vVar3.x;
  vVar3 = ::operator-(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  fVar1 = vVar3.z;
  uVar4 = vVar3._0_8_;
  vVar3 = normalized(in_stack_fffffffffffffd50);
  fVar2 = vVar3.z;
  uVar5 = vVar3._0_8_;
  vVar3 = cross(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_1e4.z = vVar3.z;
  local_1e4._0_8_ = vVar3._0_8_;
  mat3f::mat3f(&local_198,&local_1a8,&local_1c8,&local_1e4);
  a.data[0][2] = fVar1;
  a.data[0][0] = (float)(int)uVar4;
  a.data[0][1] = (float)(int)((ulong)uVar4 >> 0x20);
  a.data[1][0] = (float)in_stack_fffffffffffffdec;
  a.data[1][1] = (float)(int)uVar5;
  a.data[1][2] = (float)(int)((ulong)uVar5 >> 0x20);
  a.data[2][0] = fVar2;
  a.data[2][1] = (float)in_stack_fffffffffffffdfc;
  a.data[2][2] = fVar6;
  inverse(a);
  memcpy(in_RDI + 0xd,local_174,0x24);
  return;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}